

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_schnorr.cpp
# Opt level: O0

PubkeyDataStruct *
cfd::js::api::json::SchnorrApi::ComputeSigPointSchnorrPubkey
          (PubkeyDataStruct *__return_storage_ptr__,ComputeSigPointRequestStruct *request)

{
  ComputeSigPointRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::ComputeSigPointRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ComputeSigPointRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  ComputeSigPointRequestStruct *request_local;
  PubkeyDataStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::function<cfd::js::api::PubkeyDataStruct(cfd::js::api::ComputeSigPointRequestStruct_const&)>::
  function<cfd::js::api::json::SchnorrApi::ComputeSigPointSchnorrPubkey(cfd::js::api::ComputeSigPointRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::PubkeyDataStruct(cfd::js::api::ComputeSigPointRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"ComputeSigPointSchnorrPubkey",&local_129);
  ExecuteStructApi<cfd::js::api::ComputeSigPointRequestStruct,cfd::js::api::PubkeyDataStruct>
            ((PubkeyDataStruct *)(local_108 + 0x20),(api *)this,
             (ComputeSigPointRequestStruct *)local_108,&local_128,in_R8);
  PubkeyDataStruct::operator=(__return_storage_ptr__,(PubkeyDataStruct *)(local_108 + 0x20));
  PubkeyDataStruct::~PubkeyDataStruct((PubkeyDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::ComputeSigPointRequestStruct_&)>
  ::~function((function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::ComputeSigPointRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct SchnorrApi::ComputeSigPointSchnorrPubkey(
    const ComputeSigPointRequestStruct& request) {
  auto call_func =
      [](const ComputeSigPointRequestStruct& request) -> PubkeyDataStruct {
    PubkeyDataStruct response;

    SchnorrPubkey schnorr_pubkey(request.schnorr_pubkey);
    SchnorrPubkey nonce(request.nonce);
    ByteData256 message = GetMessage(request.message, request.is_hashed);
    auto pubkey = SchnorrUtil::ComputeSigPoint(message, nonce, schnorr_pubkey);
    response.pubkey = pubkey.GetHex();
    return response;
  };

  PubkeyDataStruct result;
  result = ExecuteStructApi<ComputeSigPointRequestStruct, PubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}